

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

D_Sym * new_D_Sym(D_Scope *st,char *name,char *end,int sizeof_D_Sym)

{
  uint uVar1;
  size_t sVar2;
  D_Sym *s_00;
  int local_40;
  int local_38;
  D_Sym *s;
  uint len;
  int sizeof_D_Sym_local;
  char *end_local;
  char *name_local;
  D_Scope *st_local;
  
  if (end == (char *)0x0) {
    if (name == (char *)0x0) {
      local_40 = 0;
    }
    else {
      sVar2 = strlen(name);
      local_40 = (int)sVar2;
    }
    local_38 = local_40;
  }
  else {
    local_38 = (int)end - (int)name;
  }
  s_00 = (D_Sym *)malloc((long)sizeof_D_Sym);
  memset(s_00,0,(long)sizeof_D_Sym);
  s_00->name = name;
  s_00->len = local_38;
  uVar1 = strhashl(name,local_38);
  s_00->hash = uVar1;
  s_00->scope = st;
  if (st != (D_Scope *)0x0) {
    if (st->hash == (D_SymHash *)0x0) {
      s_00->next = st->ll;
      st->ll = s_00;
    }
    else {
      symhash_add(st->hash,s_00);
    }
  }
  return s_00;
}

Assistant:

D_Sym *new_D_Sym(D_Scope *st, char *name, char *end, int sizeof_D_Sym) {
  uint len = end ? end - name : name ? strlen(name) : 0;
  D_Sym *s = MALLOC(sizeof_D_Sym);
  memset(s, 0, sizeof_D_Sym);
  s->name = name;
  s->len = len;
  s->hash = strhashl(name, len);
  s->scope = st;
  if (st) {
    if (st->hash) {
      symhash_add(st->hash, s);
    } else {
      s->next = st->ll;
      st->ll = s;
    }
  }
  return s;
}